

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  ImVec4 *pIVar4;
  long lVar5;
  ImVec4 *__dest;
  int iVar6;
  int iVar7;
  undefined7 in_register_00000031;
  uint uVar8;
  uint uVar9;
  undefined8 in_XMM0_Qb;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  
  auVar13._8_8_ = in_XMM0_Qb;
  auVar13._0_8_ = cr_min;
  fVar10 = cr_max.x;
  fVar11 = cr_max.y;
  fVar14 = fVar11;
  if (((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) != 0) &&
     (lVar5 = (long)(this->_ClipRectStack).Size, lVar5 != 0)) {
    pIVar4 = (this->_ClipRectStack).Data;
    uVar1 = pIVar4[lVar5 + -1].x;
    uVar2 = pIVar4[lVar5 + -1].y;
    auVar12._4_4_ = uVar2;
    auVar12._0_4_ = uVar1;
    auVar12._8_8_ = 0;
    auVar13 = maxps(auVar12,auVar13);
    cr_min = auVar13._0_8_;
    fVar14 = pIVar4[lVar5 + -1].z;
    if (fVar10 <= pIVar4[lVar5 + -1].z) {
      fVar14 = fVar10;
    }
    fVar10 = fVar14;
    fVar14 = pIVar4[lVar5 + -1].w;
    if (fVar11 <= pIVar4[lVar5 + -1].w) {
      fVar14 = fVar11;
    }
  }
  iVar7 = (this->_ClipRectStack).Size;
  iVar3 = (this->_ClipRectStack).Capacity;
  if (iVar7 == iVar3) {
    iVar7 = iVar7 + 1;
    if (iVar3 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar3 / 2 + iVar3;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar3 < iVar7) {
      __dest = (ImVec4 *)ImGui::MemAlloc((long)iVar7 << 4);
      pIVar4 = (this->_ClipRectStack).Data;
      if (pIVar4 != (ImVec4 *)0x0) {
        memcpy(__dest,pIVar4,(long)(this->_ClipRectStack).Size << 4);
        ImGui::MemFree((this->_ClipRectStack).Data);
      }
      (this->_ClipRectStack).Data = __dest;
      (this->_ClipRectStack).Capacity = iVar7;
    }
  }
  uVar8 = -(uint)(fVar14 <= cr_min.y);
  uVar9 = -(uint)(fVar10 <= cr_min.x);
  pIVar4 = (this->_ClipRectStack).Data;
  iVar7 = (this->_ClipRectStack).Size;
  pIVar4[iVar7].x = cr_min.x;
  pIVar4[iVar7].y = cr_min.y;
  pIVar4[iVar7].z = (float)(~uVar9 & (uint)fVar10 | uVar9 & (uint)cr_min.x);
  pIVar4[iVar7].w = (float)(~uVar8 & (uint)fVar14 | (uint)cr_min.y & uVar8);
  (this->_ClipRectStack).Size = (this->_ClipRectStack).Size + 1;
  UpdateClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect && _ClipRectStack.Size)
    {
        ImVec4 current = _ClipRectStack.Data[_ClipRectStack.Size-1];
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    UpdateClipRect();
}